

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc stbi__skip_jpeg_junk_at_end(stbi__jpeg *j)

{
  int iVar1;
  stbi_uc x;
  undefined7 in_stack_ffffffffffffffe8;
  stbi_uc in_stack_ffffffffffffffef;
  
  do {
    iVar1 = stbi__at_eof((stbi__context *)
                         CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    if (iVar1 != 0) {
      return 0xff;
    }
    in_stack_ffffffffffffffef =
         stbi__get8((stbi__context *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    while (in_stack_ffffffffffffffef == 0xff) {
      iVar1 = stbi__at_eof((stbi__context *)CONCAT17(0xff,in_stack_ffffffffffffffe8));
      if (iVar1 != 0) {
        return 0xff;
      }
      in_stack_ffffffffffffffef =
           stbi__get8((stbi__context *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8)
                     );
      if ((in_stack_ffffffffffffffef != '\0') && (in_stack_ffffffffffffffef != 0xff)) {
        return in_stack_ffffffffffffffef;
      }
    }
  } while( true );
}

Assistant:

static stbi_uc stbi__skip_jpeg_junk_at_end(stbi__jpeg *j)
{
   // some JPEGs have junk at end, skip over it but if we find what looks
   // like a valid marker, resume there
   while (!stbi__at_eof(j->s)) {
      stbi_uc x = stbi__get8(j->s);
      while (x == 0xff) { // might be a marker
         if (stbi__at_eof(j->s)) return STBI__MARKER_none;
         x = stbi__get8(j->s);
         if (x != 0x00 && x != 0xff) {
            // not a stuffed zero or lead-in to another marker, looks
            // like an actual marker, return it
            return x;
         }
         // stuffed zero has x=0 now which ends the loop, meaning we go
         // back to regular scan loop.
         // repeated 0xff keeps trying to read the next byte of the marker.
      }
   }
   return STBI__MARKER_none;
}